

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

CK_OBJECT_HANDLE __thiscall
HandleManager::addTokenObject
          (HandleManager *this,CK_SLOT_ID slotID,bool isPrivate,CK_VOID_PTR object)

{
  map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  *this_00;
  mapped_type mVar1;
  iterator __position;
  iterator iVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  CK_ULONG *__k;
  CK_VOID_PTR object_local;
  MutexLocker lock;
  Handle h;
  
  object_local = object;
  MutexLocker::MutexLocker(&lock,this->handlesMutex);
  this_00 = &this->objects;
  __position = std::
               _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
               ::find(&this_00->_M_t,&object_local);
  if ((_Rb_tree_header *)__position._M_node == &(this->objects)._M_t._M_impl.super__Rb_tree_header)
  {
    Handle::Handle(&h,2,slotID);
    h.object = object_local;
    this->handleCounter = this->handleCounter + 1;
    __k = &this->handleCounter;
    h.isPrivate = isPrivate;
    pmVar3 = std::
             map<unsigned_long,_Handle,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
             ::operator[](&this->handles,__k);
    pmVar3->isPrivate = h.isPrivate;
    pmVar3->hSession = h.hSession;
    pmVar3->object = h.object;
    pmVar3->kind = h.kind;
    pmVar3->slotID = h.slotID;
    mVar1 = *__k;
    pmVar4 = std::
             map<void_*,_unsigned_long,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
             ::operator[](this_00,&object_local);
    *pmVar4 = mVar1;
    p_Var5 = (_Base_ptr)*__k;
  }
  else {
    iVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Handle>,_std::_Select1st<std::pair<const_unsigned_long,_Handle>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Handle>_>_>
            ::find(&(this->handles)._M_t,(key_type *)&__position._M_node[1]._M_parent);
    if ((((_Rb_tree_header *)iVar2._M_node == &(this->handles)._M_t._M_impl.super__Rb_tree_header)
        || (iVar2._M_node[1]._M_parent != (_Base_ptr)0x2)) ||
       (iVar2._M_node[1]._M_left != (_Base_ptr)slotID)) {
      std::
      _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
      ::erase_abi_cxx11_((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                          *)this_00,__position);
      p_Var5 = (_Base_ptr)0x0;
    }
    else {
      p_Var5 = __position._M_node[1]._M_parent;
    }
  }
  MutexLocker::~MutexLocker(&lock);
  return (CK_OBJECT_HANDLE)p_Var5;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::addTokenObject(CK_SLOT_ID slotID, bool isPrivate, CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	// Return existing handle when the object has already been registered.
	std::map< CK_VOID_PTR, CK_ULONG>::iterator oit = objects.find(object);
	if (oit != objects.end()) {
		std::map< CK_ULONG, Handle>::iterator hit = handles.find(oit->second);
		if (hit == handles.end() || CKH_OBJECT != hit->second.kind || slotID != hit->second.slotID) {
			objects.erase(oit);
			return CK_INVALID_HANDLE;
		} else
			return oit->second;
	}

	// Token objects are not associated with a specific session.
	Handle h( CKH_OBJECT, slotID );
	h.isPrivate = isPrivate;
	h.object = object;
	handles[++handleCounter] = h;
	objects[object] = handleCounter;
	return (CK_OBJECT_HANDLE)handleCounter;
}